

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O2

apx_client_t * apx_client_new(void)

{
  apx_error_t aVar1;
  apx_client_t *self;
  
  self = (apx_client_t *)malloc(0x78);
  if (self != (apx_client_t *)0x0) {
    aVar1 = apx_client_create(self);
    if (aVar1 == 0) {
      return self;
    }
    free(self);
  }
  return (apx_client_t *)0x0;
}

Assistant:

apx_client_t DLL_PUBLIC *apx_client_new(void)
{
   apx_client_t *self = (apx_client_t*) malloc(sizeof(apx_client_t));
   if(self != NULL)
   {
      apx_error_t result = apx_client_create(self);
      if (result != APX_NO_ERROR)
      {
         free(self);
         self = NULL;
      }
   }
   return self;
}